

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTportWeight.c
# Opt level: O1

u_int sbfTport_topicWeight(sbfTport tport,sbfTopic topic)

{
  sbfTportWeight *psVar1;
  int iVar2;
  char *__string;
  ulong uVar3;
  long lVar4;
  
  if (tport->mWeightsListSize != 0) {
    lVar4 = 8;
    uVar3 = 0;
    do {
      psVar1 = tport->mWeightsList;
      __string = sbfTopic_getTopic(topic);
      iVar2 = regexec((regex_t *)((long)&psVar1->mWeight + lVar4),__string,0,(regmatch_t *)0x0,0);
      if (iVar2 == 0) {
        return *(u_int *)((long)psVar1 + lVar4 + -8);
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x48;
    } while (uVar3 < tport->mWeightsListSize);
  }
  return 1;
}

Assistant:

u_int
sbfTport_topicWeight (sbfTport tport, sbfTopic topic)
{
    sbfTportWeight* w;
    u_int           i;

    for (i = 0; i < tport->mWeightsListSize; i++)
    {
        w = &tport->mWeightsList[i];
        if (regexec (&w->mPattern, sbfTopic_getTopic (topic), 0, NULL, 0) == 0)
            return w->mWeight;
    }
    return 1;
}